

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall cs::compile_error::~compile_error(compile_error *this)

{
  compile_error *in_RDI;
  
  ~compile_error(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

~compile_error() override = default;